

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendReadFIFOQueueResponse
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 ByteCount,U16 FIFOCount,U16 *Values)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  char cVar4;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  ulong uVar7;
  
  if (this->mSettings->mModbusMode == ModbusRTUServer) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x18);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(ByteCount & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(ByteCount >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(FIFOCount & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(FIFOCount >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    if (FIFOCount != 0) {
      uVar7 = 0;
      do {
        CreateModbusByte(this,(ulong)(byte)Values[uVar7]);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        CreateModbusByte(this,(ulong)*(byte *)((long)Values + uVar7 * 2 + 1));
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        uVar7 = uVar7 + 1;
      } while (FIFOCount != uVar7);
    }
    uVar2 = this->crc_tab16
            [(ushort)(FIFOCount ^
                      this->crc_tab16
                      [(ushort)(ByteCount ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                               this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]) &
                       0xff] >> 8 ^
                     this->crc_tab16
                     [(uint)(ByteCount >> 8) ^
                      (ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7] >> 8
                              ^ this->crc_tab16
                                [(ushort)(ByteCount ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                         this->crc_tab16
                                         [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]) & 0xff])
                      & 0xff]) & 0xff] >> 8 ^
            this->crc_tab16
            [(uint)(FIFOCount >> 8) ^
             (ushort)(this->crc_tab16
                      [(uint)(ByteCount >> 8) ^
                       (ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7] >> 8
                               ^ this->crc_tab16
                                 [(ushort)(ByteCount ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                          this->crc_tab16
                                          [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]) & 0xff])
                       & 0xff] >> 8 ^
                     this->crc_tab16
                     [(ushort)(FIFOCount ^
                               this->crc_tab16
                               [(ushort)(ByteCount ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                        this->crc_tab16
                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]) & 0xff] >>
                               8 ^ this->crc_tab16
                                   [(uint)(ByteCount >> 8) ^
                                    (ushort)(this->crc_tab16
                                             [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7] >> 8 ^
                                            this->crc_tab16
                                            [(ushort)(ByteCount ^
                                                      this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                     this->crc_tab16
                                                     [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7
                                                     ]) & 0xff]) & 0xff]) & 0xff]) & 0xff];
    if (FIFOCount != 0) {
      uVar7 = 0;
      do {
        uVar2 = this->crc_tab16[(uVar2 ^ Values[uVar7]) & 0xff] >> 8 ^
                this->crc_tab16
                [(ushort)((uVar2 ^ Values[uVar7]) >> 8 ^
                         this->crc_tab16[(uVar2 ^ Values[uVar7]) & 0xff]) & 0xff];
        uVar7 = uVar7 + 1;
      } while (FIFOCount != uVar7);
    }
    CreateModbusByte(this,(ulong)uVar2 & 0xff);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar2 >> 8);
  }
  else {
    sVar3 = DeviceID + ByteCount + (ByteCount >> 8) + FIFOCount + (FIFOCount >> 8) + 0x18;
    cVar4 = (char)sVar3;
    if (FIFOCount != 0) {
      uVar7 = 0;
      do {
        sVar3 = (Values[uVar7] >> 8) + sVar3 + Values[uVar7];
        cVar4 = (char)sVar3;
        uVar7 = uVar7 + 1;
      } while (FIFOCount != uVar7);
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x31);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x38);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(byte)(ByteCount >> 0xc));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(U8)((ByteCount & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(byte)ByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(U8)(ByteCount & 0xf0f));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(byte)(FIFOCount >> 0xc));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(U8)((FIFOCount & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(byte)(FIFOCount >> 4) & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar6,(U8)(FIFOCount & 0xf0f));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    if (FIFOCount != 0) {
      uVar7 = 0;
      do {
        bVar1 = BinToLATIN1(pMVar6,(byte)(Values[uVar7] >> 0xc));
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar1 = BinToLATIN1(pMVar6,*(byte *)((long)Values + uVar7 * 2 + 1) & 0xf);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar1 = BinToLATIN1(pMVar6,(byte)Values[uVar7] >> 4);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar1 = BinToLATIN1(pMVar6,(byte)Values[uVar7] & 0xf);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        uVar7 = uVar7 + 1;
      } while (FIFOCount != uVar7);
    }
    bVar1 = BinToLATIN1(pMVar6,(byte)-cVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(this_00,-cVar4 & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendReadFIFOQueueResponse( U8 DeviceID, U16 ByteCount, U16 FIFOCount, U16 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x18 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ByteCount & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FIFOCount & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( FIFOCount & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < FIFOCount; i++ )
        {
            CreateModbusByte( Values[ i ] & 0x00FF );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

            CreateModbusByte( ( Values[ i ] & 0xFF00 ) >> 8 );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x18 );
        CRCValue = update_CRC( CRCValue, ByteCount & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( ByteCount & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, FIFOCount & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( FIFOCount & 0xFF00 ) >> 8 );

        for( int i = 0; i < FIFOCount; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] & 0x00FF );
            CRCValue = update_CRC( CRCValue, ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x18;
        LRCvalue = LRCvalue + ByteCount & 0x00FF;
        LRCvalue = LRCvalue + ( ( ByteCount & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + FIFOCount & 0x00FF;
        LRCvalue = LRCvalue + ( ( FIFOCount & 0xFF00 ) >> 8 );

        for( int i = 0; i < FIFOCount; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ] & 0x00FF;
            LRCvalue = LRCvalue + ( ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( 0x1 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( 0x8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FIFOCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );


        for( int i = 0; i < FIFOCount; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF000 ) >> 12 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0x0F00 ) >> 8 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}